

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void tree_sitter_bash_external_scanner_destroy(void *payload)

{
  long lVar1;
  Heredoc *heredoc;
  size_t i;
  Scanner *scanner;
  void *payload_local;
  
  heredoc = (Heredoc *)0x0;
  while( true ) {
    if ((Heredoc *)(ulong)*(uint *)((long)payload + 0x10) <= heredoc) {
      _array__delete((Array *)((long)payload + 8));
      free(payload);
      return;
    }
    if (*(uint *)((long)payload + 0x10) <= (uint)heredoc) break;
    lVar1 = *(long *)((long)payload + 8) + (long)heredoc * 0x28;
    _array__delete((Array *)(lVar1 + 0x18));
    _array__delete((Array *)(lVar1 + 8));
    heredoc = (Heredoc *)&heredoc->started;
  }
  __assert_fail("(uint32_t)(i) < (&scanner->heredocs)->size",
                "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                ,0x4bb,"void tree_sitter_bash_external_scanner_destroy(void *)");
}

Assistant:

void tree_sitter_bash_external_scanner_destroy(void *payload) {
    Scanner *scanner = (Scanner *)payload;
    for (size_t i = 0; i < scanner->heredocs.size; i++) {
        Heredoc *heredoc = array_get(&scanner->heredocs, i);
        array_delete(&heredoc->current_leading_word);
        array_delete(&heredoc->delimiter);
    }
    array_delete(&scanner->heredocs);
    free(scanner);
}